

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.cpp
# Opt level: O1

void __thiscall r_exec::SaliencyPropagationJob::report(SaliencyPropagationJob *this,int64_t lag)

{
  int iVar1;
  DebugStream local_61;
  char *local_60;
  long local_58;
  char local_50 [16];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"saliency propagation job","")
  ;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_60,local_58);
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"late:",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"us behind.",10);
    DebugStream::~DebugStream(&local_61);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SaliencyPropagationJob::report(int64_t lag) const
{
    debug("saliency propagation job") << "late:" << lag << "us behind.";
}